

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_if.c
# Opt level: O0

void ex_sum(t_expr *e,long argc,ex_ex *argv,ex_ex *optr)

{
  int iVar1;
  t_pd local_58;
  int local_50;
  float local_4c;
  int indx;
  t_float sum;
  t_word *wvec;
  _garray *p_Stack_38;
  int size;
  _garray *garray;
  t_symbol *s;
  ex_ex *optr_local;
  ex_ex *argv_local;
  long argc_local;
  t_expr *e_local;
  
  s = (t_symbol *)optr;
  optr_local = argv;
  argv_local = (ex_ex *)argc;
  argc_local = (long)e;
  if (argv->ex_type == 7) {
    garray = (_garray *)(argv->ex_cont).v_vec;
    if (((garray != (_garray *)0x0) &&
        (p_Stack_38 = (_garray *)pd_findbyclass((t_symbol *)garray,garray_class),
        p_Stack_38 != (_garray *)0x0)) &&
       (iVar1 = garray_getfloatwords(p_Stack_38,(int *)((long)&wvec + 4),(t_word **)&indx),
       iVar1 != 0)) {
      local_4c = 0.0;
      for (local_50 = 0; local_50 < wvec._4_4_; local_50 = local_50 + 1) {
        local_4c = _indx[local_50].w_float + local_4c;
      }
      s->s_thing = (_class **)0x2;
      *(float *)&s->s_name = local_4c;
      return;
    }
    s->s_thing = (_class **)0x2;
    s->s_name = (char *)0x0;
    if (garray == (_garray *)0x0) {
      local_58 = (t_pd)0x21447e;
    }
    else {
      local_58 = (garray->x_gobj).g_pd;
    }
    pd_error((void *)0x0,"no such table \'%s\'",local_58);
  }
  else {
    post("expr: sum: need a table name\n");
    s->s_thing = (_class **)&DAT_00000001;
    s->s_name = (char *)0x0;
  }
  return;
}

Assistant:

void
ex_sum(t_expr *e, long int argc, struct ex_ex *argv, struct ex_ex *optr)
{
        t_symbol *s;
        t_garray *garray;
        int size;
        t_word *wvec;
        t_float sum;
        int indx;

        if (argv->ex_type != ET_SYM)
        {
                post("expr: sum: need a table name\n");
                optr->ex_type = ET_INT;
                optr->ex_int = 0;
                return;
        }

        s = (fts_symbol_t ) argv->ex_ptr;

        ISTABLE(s, garray, size, wvec);

        for (indx = 0, sum = 0; indx < size; indx++)
                sum += wvec[indx].w_float;

        optr->ex_type = ET_FLT;
        optr->ex_flt = sum;
}